

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

Status * __thiscall
draco::ObjDecoder::DecodeInternal(Status *__return_storage_ptr__,ObjDecoder *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ValueType VVar3;
  uint uVar4;
  PointCloud *this_00;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var5;
  size_t sVar6;
  ulong uVar7;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> _Var8;
  __uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> this_01;
  bool bVar9;
  ValueType VVar10;
  int iVar11;
  int iVar12;
  tuple<draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_> this_02;
  AttributeMetadata *pAVar13;
  _Rb_tree_header *p_Var14;
  int64_t iVar15;
  DataType DVar16;
  AttributeValueIndex avi;
  _Hash_node_base *p_Var17;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  FaceIndex face_id;
  __node_base *p_Var20;
  undefined1 auVar21 [16];
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> metadata;
  AttributeValueIndex i_1;
  undefined4 uStack_104;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Status status;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_c0;
  _Head_base<0UL,_draco::AttributeMetadata_*,_false> local_b8;
  __uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_b0
  ;
  GeometryAttribute va;
  uint8_t i;
  undefined7 uStack_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long lVar22;
  
  this->counting_mode_ = true;
  piVar1 = &this->num_obj_faces_;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->material_name_to_id_)._M_h);
  this->last_sub_obj_id_ = 0;
  status.error_msg_._M_dataplus._M_p = (pointer)&status.error_msg_.field_2;
  status.code_ = OK;
  status.error_msg_._M_string_length = 0;
  status.error_msg_.field_2._M_local_buf[0] = '\0';
  do {
    bVar9 = ParseDefinition(this,&status);
  } while (bVar9 && status.code_ == OK);
  if (status.code_ == OK) {
    if ((this->mesh_files_ !=
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0) && ((this->input_file_name_)._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->mesh_files_,&this->input_file_name_);
    }
    iVar12 = *piVar1;
    if ((long)iVar12 == 0) {
      iVar11 = this->num_positions_;
      if (iVar11 == 0) {
        va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
        std::__cxx11::string::_M_construct<char_const*>((string *)&va,"No position attribute","");
        __return_storage_ptr__->code_ = DRACO_ERROR;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                   (long)&((va.buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,
                            (undefined4)va.buffer_descriptor_.buffer_id));
      }
      else if (this->num_tex_coords_ == iVar11 || this->num_tex_coords_ < 1) {
        if (this->num_normals_ == iVar11 || this->num_normals_ < 1) {
          this->out_mesh_ = (Mesh *)0x0;
          goto LAB_00113863;
        }
        va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&va,"Invalid number of normals for a point cloud","");
        __return_storage_ptr__->code_ = DRACO_ERROR;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                   (long)&((va.buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,
                            (undefined4)va.buffer_descriptor_.buffer_id));
      }
      else {
        va.buffer_ = (DataBuffer *)&va.buffer_descriptor_.buffer_update_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&va,"Invalid number of texture coordinates for a point cloud","");
        __return_storage_ptr__->code_ = DRACO_ERROR;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,va.buffer_,
                   (long)&((va.buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                   CONCAT44(va.buffer_descriptor_.buffer_id._4_4_,
                            (undefined4)va.buffer_descriptor_.buffer_id));
      }
      if (va.buffer_ != (DataBuffer *)&va.buffer_descriptor_.buffer_update_count) {
        operator_delete(va.buffer_,va.buffer_descriptor_.buffer_update_count + 1);
      }
      goto LAB_00114318;
    }
LAB_00113863:
    if (this->out_mesh_ != (Mesh *)0x0) {
      va.buffer_descriptor_.buffer_id._0_4_ = 0;
      va.buffer_ = (DataBuffer *)0x0;
      std::
      vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
      ::resize(&(this->out_mesh_->faces_).vector_,(long)iVar12,(value_type *)&va);
    }
    VVar3 = this->num_positions_;
    VVar10 = this->num_obj_faces_ * 3;
    if (this->num_obj_faces_ < 1) {
      VVar10 = VVar3;
    }
    this->out_point_cloud_->num_points_ = VVar10;
    if (0 < (int)VVar3) {
      GeometryAttribute::GeometryAttribute(&va);
      GeometryAttribute::Init(&va,POSITION,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
      iVar11 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar12 == 0,this->num_positions_)
      ;
      this->pos_att_id_ = iVar11;
    }
    if (0 < this->num_tex_coords_) {
      GeometryAttribute::GeometryAttribute(&va);
      GeometryAttribute::Init(&va,TEX_COORD,(DataBuffer *)0x0,'\x02',DT_FLOAT32,false,8,0);
      iVar11 = PointCloud::AddAttribute
                         (this->out_point_cloud_,&va,iVar12 == 0,this->num_tex_coords_);
      this->tex_att_id_ = iVar11;
    }
    if (0 < this->num_normals_) {
      GeometryAttribute::GeometryAttribute(&va);
      GeometryAttribute::Init(&va,NORMAL,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
      iVar12 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar12 == 0,this->num_normals_);
      this->norm_att_id_ = iVar12;
    }
    if ((this->preserve_polygons_ == true) && (this->has_polygons_ == true)) {
      GeometryAttribute::GeometryAttribute(&va);
      GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DT_UINT8,false,1,0);
      this_00 = this->out_point_cloud_;
      iVar12 = PointCloud::AddAttribute(this_00,&va,false,2);
      this->added_edge_att_id_ = iVar12;
      _i_1 = (pointer)0x100000000;
      lVar18 = 0;
      do {
        uVar4 = *(uint *)((long)&i_1.value_ + lVar18);
        i = (char)uVar4;
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this_00->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->added_edge_att_id_]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        sVar6 = *(size_t *)
                 ((long)_Var5._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
        memcpy((void *)(sVar6 * (uVar4 & 0xff) +
                       **(long **)_Var5._M_t.
                                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                  _M_head_impl),&i,sVar6);
        lVar18 = lVar18 + 4;
      } while (lVar18 != 8);
      this_02.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
            )operator_new(0x68);
      (((_Rb_tree_header *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 8))->
      _M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x10) =
           (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x18) =
           (_Base_ptr)
           ((long)this_02.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 8);
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x20) =
           (_Base_ptr)
           ((long)this_02.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 8);
      *(size_t *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x28) = 0;
      (((_Rb_tree_header *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x38))->
      _M_header)._M_color = _S_red;
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x40) =
           (_Base_ptr)0x0;
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x48) =
           (_Base_ptr)
           ((long)this_02.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x38);
      *(_Base_ptr *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x50) =
           (_Base_ptr)
           ((long)this_02.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x38);
      *(size_t *)
       ((long)this_02.
              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x58) = 0;
      *(undefined4 *)
       &(((Metadata *)
         ((long)this_02.
                super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x60))->
        entries_)._M_t._M_impl = 0;
      _i_1 = (pointer)&local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
      _i = (pointer)&local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&i,"added_edges","");
      Metadata::AddEntryString
                ((Metadata *)
                 this_02.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                 (string *)&i_1,(string *)&i);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i != &local_58) {
        operator_delete(_i,local_58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_i_1 != &local_f8) {
        operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
      }
      local_b0._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (tuple<draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>)
           (tuple<draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>)
           this_02.
           super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
           .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      PointCloud::AddAttributeMetadata
                (this_00,this->added_edge_att_id_,
                 (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  *)&local_b0);
      this_01._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           local_b0._M_t.
           super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
           .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
           )local_b0._M_t.
            super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
            .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl !=
          (AttributeMetadata *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
                     *)((long)local_b0._M_t.
                              super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                              .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl
                       + 0x30));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                     *)this_01._M_t.
                       super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                       .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
        operator_delete((void *)this_01._M_t.
                                super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                                .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>.
                                _M_head_impl,0x68);
      }
      local_b0._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (tuple<draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>)
           (_Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
            )0x0;
    }
    if ((0 < this->num_materials_) && (0 < this->num_obj_faces_)) {
      GeometryAttribute::GeometryAttribute(&va);
      iVar12 = this->num_materials_;
      bVar9 = 0xffff < iVar12;
      DVar16 = DT_UINT8;
      if (0xff < iVar12) {
        DVar16 = bVar9 + 4 + (uint)bVar9;
      }
      iVar15 = 1;
      if (0xff < iVar12) {
        iVar15 = (ulong)((uint)bVar9 * 2) + 2;
      }
      GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar16,false,iVar15,0);
      iVar12 = PointCloud::AddAttribute(this->out_point_cloud_,&va,false,this->num_materials_);
      this->material_att_id_ = iVar12;
      _i_1 = _i_1 & 0xffffffff00000000;
      if (0 < this->num_materials_) {
        lVar18 = 0;
        do {
          _Var5._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (this->out_point_cloud_->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->material_att_id_]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          sVar6 = *(size_t *)
                   ((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28
                   );
          memcpy((void *)(sVar6 * lVar18 +
                         **(long **)_Var5._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl),&i_1,sVar6);
          lVar18 = lVar18 + 1;
          i_1.value_ = (int)lVar18;
        } while (lVar18 < this->num_materials_);
      }
      if (this->use_metadata_ != false) {
        pAVar13 = (AttributeMetadata *)operator_new(0x68);
        p_Var14 = (_Rb_tree_header *)
                  (&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8);
        (((_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8))->
        _M_header)._M_color = _S_red;
        *(_Base_ptr *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x10) =
             (_Base_ptr)0x0;
        *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x18) =
             p_Var14;
        *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x20) =
             p_Var14;
        *(size_t *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x28) = 0;
        p_Var14 = &(pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = _S_red;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = (_Base_ptr)0x0;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = &p_Var14->_M_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = &p_Var14->_M_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             0;
        pAVar13->att_unique_id_ = 0;
        _i_1 = (pointer)&local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
        _i = (pointer)&local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&i,"material","");
        Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,(string *)&i);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_i != &local_58) {
          operator_delete(_i,local_58._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_i_1 != &local_f8) {
          operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
        }
        p_Var20 = &(this->material_name_to_id_)._M_h._M_before_begin;
        while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
          Metadata::AddEntryInt
                    ((Metadata *)pAVar13,(string *)(p_Var20 + 1),*(int32_t *)&p_Var20[5]._M_nxt);
        }
        if ((this->material_file_name_)._M_string_length != 0) {
          _i_1 = (pointer)&local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"file_name","");
          Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,&this->material_file_name_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_i_1 != &local_f8) {
            operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
          }
        }
        local_b8._M_head_impl = pAVar13;
        PointCloud::AddAttributeMetadata
                  (this->out_point_cloud_,this->material_att_id_,
                   (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)&local_b8);
        _Var8._M_head_impl = local_b8._M_head_impl;
        if (local_b8._M_head_impl != (AttributeMetadata *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
          ::~_Rb_tree(&((local_b8._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                       *)_Var8._M_head_impl);
          operator_delete(_Var8._M_head_impl,0x68);
        }
        local_b8._M_head_impl = (AttributeMetadata *)0x0;
      }
    }
    if (((this->obj_name_to_id_)._M_h._M_element_count != 0) && (0 < this->num_obj_faces_)) {
      GeometryAttribute::GeometryAttribute(&va);
      uVar7 = (this->obj_name_to_id_)._M_h._M_element_count;
      bVar9 = 0xffff < uVar7;
      DVar16 = DT_UINT8;
      if (0xff < uVar7) {
        DVar16 = bVar9 + 4 + (uint)bVar9;
      }
      iVar15 = 1;
      if (0xff < uVar7) {
        iVar15 = (ulong)((uint)bVar9 * 2) + 2;
      }
      GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar16,false,iVar15,0);
      iVar12 = PointCloud::AddAttribute
                         (this->out_point_cloud_,&va,false,
                          (ValueType)(this->obj_name_to_id_)._M_h._M_element_count);
      this->sub_obj_att_id_ = iVar12;
      p_Var17 = (this->obj_name_to_id_)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          i_1.value_ = *(uint *)&p_Var17[5]._M_nxt;
          _Var5._M_t.
          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
               (this->out_point_cloud_->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->sub_obj_att_id_]._M_t.
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t;
          sVar6 = *(size_t *)
                   ((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28
                   );
          memcpy((void *)(*(uint *)&p_Var17[5]._M_nxt * sVar6 +
                         **(long **)_Var5._M_t.
                                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                    _M_head_impl),&i_1,sVar6);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
      }
      if (this->use_metadata_ != false) {
        pAVar13 = (AttributeMetadata *)operator_new(0x68);
        p_Var14 = (_Rb_tree_header *)
                  (&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8);
        (((_Rb_tree_header *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 8))->
        _M_header)._M_color = _S_red;
        *(_Base_ptr *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x10) =
             (_Base_ptr)0x0;
        *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x18) =
             p_Var14;
        *(_Rb_tree_header **)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x20) =
             p_Var14;
        *(size_t *)(&(pAVar13->super_Metadata).entries_._M_t._M_impl.field_0x0 + 0x28) = 0;
        p_Var14 = &(pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_color = _S_red;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_parent = (_Base_ptr)0x0;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_left = &p_Var14->_M_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_header.
        _M_right = &p_Var14->_M_header;
        (pAVar13->super_Metadata).sub_metadatas_._M_t._M_impl.super__Rb_tree_header._M_node_count =
             0;
        pAVar13->att_unique_id_ = 0;
        _i_1 = (pointer)&local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&i_1,"name","");
        _i = (pointer)&local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&i,"sub_obj","");
        Metadata::AddEntryString((Metadata *)pAVar13,(string *)&i_1,(string *)&i);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_i != &local_58) {
          operator_delete(_i,local_58._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_i_1 != &local_f8) {
          operator_delete(_i_1,local_f8._M_allocated_capacity + 1);
        }
        p_Var20 = &(this->obj_name_to_id_)._M_h._M_before_begin;
        while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
          Metadata::AddEntryInt
                    ((Metadata *)pAVar13,(string *)(p_Var20 + 1),*(int32_t *)&p_Var20[5]._M_nxt);
        }
        local_c0._M_head_impl = pAVar13;
        PointCloud::AddAttributeMetadata
                  (this->out_point_cloud_,this->sub_obj_att_id_,
                   (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    *)&local_c0);
        _Var8._M_head_impl = local_c0._M_head_impl;
        if (local_c0._M_head_impl != (AttributeMetadata *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
          ::~_Rb_tree(&((local_c0._M_head_impl)->super_Metadata).sub_metadatas_._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
                       *)_Var8._M_head_impl);
          operator_delete(_Var8._M_head_impl,0x68);
        }
        local_c0._M_head_impl = (AttributeMetadata *)0x0;
      }
    }
    this->counting_mode_ = false;
    this->last_material_id_ = 0;
    this->last_sub_obj_id_ = 0;
    this->num_obj_faces_ = 0;
    this->num_positions_ = 0;
    this->num_tex_coords_ = 0;
    this->num_normals_ = 0;
    (this->buffer_).pos_ = 0;
    do {
      bVar9 = ParseDefinition(this,&status);
    } while (bVar9 && status.code_ == OK);
    if (status.code_ == OK) {
      if (this->out_mesh_ != (Mesh *)0x0) {
        va.buffer_descriptor_.buffer_id._0_4_ = 0;
        va.buffer_ = (DataBuffer *)0x0;
        if (*piVar1 != 0) {
          face_id.value_ = 0;
          iVar12 = 1;
          local_48 = -0x80000000;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          do {
            lVar18 = 0;
            auVar21 = _DAT_001a7a80;
            iVar11 = iVar12;
            do {
              if (SUB164(auVar21 ^ _DAT_001a7a90,4) == local_48 &&
                  SUB164(auVar21 ^ _DAT_001a7a90,0) < -0x7ffffffd) {
                *(int *)((long)&va.buffer_ + lVar18) = iVar11 + -1;
                *(int *)((long)&va.buffer_ + lVar18 + 4) = iVar11;
              }
              lVar22 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 2;
              auVar21._8_8_ = lVar22 + 2;
              lVar18 = lVar18 + 8;
              iVar11 = iVar11 + 2;
            } while (lVar18 != 0x10);
            Mesh::SetFace(this->out_mesh_,face_id,(Face *)&va);
            face_id.value_ = face_id.value_ + 1;
            iVar12 = iVar12 + 3;
          } while (face_id.value_ < (uint)*piVar1);
        }
      }
      if (this->deduplicate_input_values_ == true) {
        (*this->out_point_cloud_->_vptr_PointCloud[4])();
      }
      (*this->out_point_cloud_->_vptr_PointCloud[5])();
    }
  }
  paVar19 = &status.error_msg_.field_2;
  __return_storage_ptr__->code_ = status.code_;
  paVar2 = &(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)status.error_msg_._M_dataplus._M_p == paVar19) {
    paVar2->_M_allocated_capacity =
         CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                  status.error_msg_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->error_msg_).field_2 + 8) =
         status.error_msg_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = status.error_msg_._M_dataplus._M_p;
    (__return_storage_ptr__->error_msg_).field_2._M_allocated_capacity =
         CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                  status.error_msg_.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->error_msg_)._M_string_length = status.error_msg_._M_string_length;
  status.error_msg_._M_string_length = 0;
  status.error_msg_.field_2._M_local_buf[0] = '\0';
  status.error_msg_._M_dataplus._M_p = (pointer)paVar19;
LAB_00114318:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)status.error_msg_._M_dataplus._M_p != &status.error_msg_.field_2) {
    operator_delete(status.error_msg_._M_dataplus._M_p,
                    CONCAT71(status.error_msg_.field_2._M_allocated_capacity._1_7_,
                             status.error_msg_.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeInternal() {
  // In the first pass, count the number of different elements in the geometry.
  // In case the desired output is just a point cloud (i.e., when
  // out_mesh_ == nullptr) the decoder will ignore all information about the
  // connectivity that may be included in the source data.
  counting_mode_ = true;
  ResetCounters();
  material_name_to_id_.clear();
  last_sub_obj_id_ = 0;
  // Parse all lines.
  Status status(Status::OK);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }

  if (mesh_files_ && !input_file_name_.empty()) {
    mesh_files_->push_back(input_file_name_);
  }

  bool use_identity_mapping = false;
  if (num_obj_faces_ == 0) {
    // Mesh has no faces. In this case we try to read the geometry as a point
    // cloud where every attribute entry is a point.

    // Ensure the number of all entries is same for all attributes.
    if (num_positions_ == 0) {
      return Status(Status::DRACO_ERROR, "No position attribute");
    }
    if (num_tex_coords_ > 0 && num_tex_coords_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of texture coordinates for a point cloud");
    }
    if (num_normals_ > 0 && num_normals_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of normals for a point cloud");
    }

    out_mesh_ = nullptr;  // Treat the output geometry as a point cloud.
    use_identity_mapping = true;
  }

  // Initialize point cloud and mesh properties.
  if (out_mesh_) {
    // Start decoding a mesh with the given number of faces. For point clouds we
    // silently ignore all data about the mesh connectivity.
    out_mesh_->SetNumFaces(num_obj_faces_);
  }
  if (num_obj_faces_ > 0) {
    out_point_cloud_->set_num_points(3 * num_obj_faces_);
  } else {
    out_point_cloud_->set_num_points(num_positions_);
  }

  // Add attributes if they are present in the input data.
  if (num_positions_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    pos_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_positions_);
  }
  if (num_tex_coords_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::TEX_COORD, nullptr, 2, DT_FLOAT32, false,
            sizeof(float) * 2, 0);
    tex_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_tex_coords_);
  }
  if (num_normals_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    norm_att_id_ =
        out_point_cloud_->AddAttribute(va, use_identity_mapping, num_normals_);
  }
  if (preserve_polygons_ && has_polygons_) {
    // Create attribute for polygon reconstruction.
    GeometryAttribute va;
    va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    PointCloud *const pc = out_point_cloud_;
    added_edge_att_id_ = pc->AddAttribute(va, false, 2);

    // Set attribute values to zero and one representing old edge and new edge.
    for (const uint8_t i : {0, 1}) {
      const AttributeValueIndex avi(i);
      pc->attribute(added_edge_att_id_)->SetAttributeValue(avi, &i);
    }

    // Add attribute metadata with name.
    std::unique_ptr<AttributeMetadata> metadata(new draco::AttributeMetadata());
    metadata->AddEntryString("name", "added_edges");
    pc->AddAttributeMetadata(added_edge_att_id_, std::move(metadata));
  }
  if (num_materials_ > 0 && num_obj_faces_ > 0) {
    GeometryAttribute va;
    const auto geometry_attribute_type = GeometryAttribute::GENERIC;
    if (num_materials_ < 256) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (num_materials_ < (1 << 16)) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    material_att_id_ =
        out_point_cloud_->AddAttribute(va, false, num_materials_);

    // Fill the material entries.
    for (int i = 0; i < num_materials_; ++i) {
      const AttributeValueIndex avi(i);
      out_point_cloud_->attribute(material_att_id_)->SetAttributeValue(avi, &i);
    }

    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> material_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      material_metadata->AddEntryString("name", "material");
      // Add all material names.
      for (const auto &itr : material_name_to_id_) {
        material_metadata->AddEntryInt(itr.first, itr.second);
      }
      if (!material_file_name_.empty()) {
        material_metadata->AddEntryString("file_name", material_file_name_);
      }

      out_point_cloud_->AddAttributeMetadata(material_att_id_,
                                             std::move(material_metadata));
    }
  }
  if (!obj_name_to_id_.empty() && num_obj_faces_ > 0) {
    GeometryAttribute va;
    if (obj_name_to_id_.size() < 256) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (obj_name_to_id_.size() < (1 << 16)) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    sub_obj_att_id_ = out_point_cloud_->AddAttribute(
        va, false, static_cast<uint32_t>(obj_name_to_id_.size()));
    // Fill the sub object id entries.
    for (const auto &itr : obj_name_to_id_) {
      const AttributeValueIndex i(itr.second);
      out_point_cloud_->attribute(sub_obj_att_id_)->SetAttributeValue(i, &i);
    }
    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> sub_obj_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      sub_obj_metadata->AddEntryString("name", "sub_obj");
      // Add all sub object names.
      for (const auto &itr : obj_name_to_id_) {
        const AttributeValueIndex i(itr.second);
        sub_obj_metadata->AddEntryInt(itr.first, itr.second);
      }
      out_point_cloud_->AddAttributeMetadata(sub_obj_att_id_,
                                             std::move(sub_obj_metadata));
    }
  }

  // Perform a second iteration of parsing and fill all the data.
  counting_mode_ = false;
  ResetCounters();
  // Start parsing from the beginning of the buffer again.
  buffer()->StartDecodingFrom(0);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }
  if (out_mesh_) {
    // Add faces with identity mapping between vertex and corner indices.
    // Duplicate vertices will get removed later.
    Mesh::Face face;
    for (FaceIndex i(0); i < num_obj_faces_; ++i) {
      for (int c = 0; c < 3; ++c) {
        face[c] = 3 * i.value() + c;
      }
      out_mesh_->SetFace(i, face);
    }
  }

#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  if (deduplicate_input_values_) {
    out_point_cloud_->DeduplicateAttributeValues();
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  out_point_cloud_->DeduplicatePointIds();
#endif
  return status;
}